

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O0

void ncnn::conv1x1s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  __m128 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Option *in_stack_00000bb8;
  Mat *in_stack_00000bc0;
  Mat *in_stack_00000bc8;
  Mat *in_stack_00000bd0;
  Mat *in_stack_00000bd8;
  undefined8 in_stack_fffffffffffffe70;
  int _elempack;
  size_t in_stack_fffffffffffffe78;
  Mat *this;
  undefined8 in_stack_fffffffffffffe88;
  Mat *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Allocator *in_stack_fffffffffffffea0;
  float *local_118;
  Mat local_110;
  float *local_c8;
  int local_c0;
  Mat local_b0;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined8 local_58;
  int local_50;
  int local_4c;
  float *local_20;
  undefined8 local_18;
  Mat *pMStack_10;
  float *local_8;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_4c = *(int *)(in_RDI + 0x2c);
  local_50 = *(int *)(in_RDI + 0x38);
  local_58 = *(undefined8 *)(in_RDI + 0x10);
  local_5c = *(undefined4 *)(in_RDI + 0x18);
  local_60 = *(int *)(in_RSI + 0x2c);
  local_64 = *(int *)(in_RSI + 0x30);
  local_68 = (local_4c * 2 + local_60 * -2) * 4;
  this = &local_b0;
  Mat::Mat(this);
  Mat::create(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
              (int)in_stack_fffffffffffffe88,(int)((ulong)this >> 0x20),in_stack_fffffffffffffe78,
              _elempack,in_stack_fffffffffffffea0);
  for (local_c0 = 0; local_c0 < local_50; local_c0 = local_c0 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(&local_110);
    Mat::~Mat((Mat *)0x334710);
    local_c8 = pfVar1;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    local_118 = Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffea0);
    Mat::~Mat((Mat *)0x334753);
    for (in_stack_fffffffffffffe9c = 0; in_stack_fffffffffffffe9c < local_64;
        in_stack_fffffffffffffe9c = in_stack_fffffffffffffe9c + 1) {
      for (in_stack_fffffffffffffe98 = 0; in_stack_fffffffffffffe98 < local_60;
          in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + 1) {
        local_20 = local_c8;
        local_18 = *(undefined8 *)local_c8;
        in_stack_fffffffffffffe90 = *(Mat **)(local_c8 + 2);
        local_8 = local_118;
        *(undefined8 *)local_118 = local_18;
        *(Mat **)(local_118 + 2) = in_stack_fffffffffffffe90;
        local_c8 = local_c8 + 8;
        local_118 = local_118 + 4;
        pMStack_10 = in_stack_fffffffffffffe90;
      }
      local_c8 = local_c8 + local_68;
    }
  }
  conv1x1s1_sgemm_pack4_sse
            (in_stack_00000bd8,in_stack_00000bd0,in_stack_00000bc8,in_stack_00000bc0,
             in_stack_00000bb8);
  Mat::~Mat((Mat *)0x334907);
  return;
}

Assistant:

static void conv1x1s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _v = _mm_load_ps(r0);
                _mm_store_ps(outptr, _v);

                r0 += 8;
                outptr += 4;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack4_sse(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}